

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myString.cpp
# Opt level: O0

myString * __thiscall myString::operator=(myString *this,myString *right)

{
  uint uVar1;
  char *pcVar2;
  char *__src;
  myString *right_local;
  myString *this_local;
  
  if ((this->len != 0) && (this->myStr != (char *)0x0)) {
    operator_delete__(this->myStr);
  }
  uVar1 = size(right);
  pcVar2 = (char *)operator_new__((ulong)(uVar1 + 1));
  this->myStr = pcVar2;
  pcVar2 = this->myStr;
  __src = getMyStr(right);
  strcpy(pcVar2,__src);
  uVar1 = size(right);
  this->len = uVar1;
  return this;
}

Assistant:

myString &myString::operator=(const myString &right)  {

    if (len != 0)
        delete [] myStr;
    this->myStr = new char[right.size() + 1];
    strcpy(myStr, right.getMyStr());
    len  = right.size();
    return *this;
}